

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O0

void ec_setupheader(void *p)

{
  uint16_t uVar1;
  ec_etherheadert *bp;
  void *p_local;
  
  uVar1 = htons(0xffff);
  *(uint16_t *)p = uVar1;
  uVar1 = htons(0xffff);
  *(uint16_t *)((long)p + 2) = uVar1;
  uVar1 = htons(0xffff);
  *(uint16_t *)((long)p + 4) = uVar1;
  uVar1 = htons(0x101);
  *(uint16_t *)((long)p + 6) = uVar1;
  uVar1 = htons(0x101);
  *(uint16_t *)((long)p + 8) = uVar1;
  uVar1 = htons(0x101);
  *(uint16_t *)((long)p + 10) = uVar1;
  uVar1 = htons(0x88a4);
  *(uint16_t *)((long)p + 0xc) = uVar1;
  return;
}

Assistant:

void ec_setupheader(void *p) 
{
   ec_etherheadert *bp;
   bp = p;
   bp->da0 = htons(0xffff);
   bp->da1 = htons(0xffff);
   bp->da2 = htons(0xffff);
   bp->sa0 = htons(priMAC[0]);
   bp->sa1 = htons(priMAC[1]);
   bp->sa2 = htons(priMAC[2]);
   bp->etype = htons(ETH_P_ECAT);
}